

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::MergingIterator::Next(MergingIterator *this)

{
  bool bVar1;
  int iVar2;
  IteratorWrapper *this_00;
  long *in_RDI;
  bool bVar3;
  undefined1 auVar4 [16];
  IteratorWrapper *child;
  int i;
  Slice *in_stack_ffffffffffffff98;
  IteratorWrapper *in_stack_ffffffffffffffa0;
  Slice local_48;
  undefined1 local_38 [16];
  undefined8 local_28;
  MergingIterator *in_stack_ffffffffffffffe0;
  int local_c;
  
  if ((int)in_RDI[9] != 0) {
    for (local_c = 0; local_c < (int)in_RDI[7]; local_c = local_c + 1) {
      this_00 = (IteratorWrapper *)(in_RDI[6] + (long)local_c * 0x20);
      if (this_00 != (IteratorWrapper *)in_RDI[8]) {
        in_stack_ffffffffffffffa0 = this_00;
        auVar4 = (**(code **)(*in_RDI + 0x40))();
        in_stack_ffffffffffffffe0 = auVar4._8_8_;
        local_28 = auVar4._0_8_;
        IteratorWrapper::Seek(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        bVar1 = IteratorWrapper::Valid(this_00);
        bVar3 = false;
        if (bVar1) {
          in_stack_ffffffffffffff98 = (Slice *)in_RDI[5];
          auVar4 = (**(code **)(*in_RDI + 0x40))();
          local_38 = auVar4;
          local_48 = IteratorWrapper::key(this_00);
          iVar2 = (**(code **)(in_stack_ffffffffffffff98->data_ + 0x10))
                            (in_stack_ffffffffffffff98,local_38,&local_48);
          bVar3 = iVar2 == 0;
        }
        if (bVar3) {
          IteratorWrapper::Next(in_stack_ffffffffffffffa0);
        }
      }
    }
    *(undefined4 *)(in_RDI + 9) = 0;
  }
  IteratorWrapper::Next(in_stack_ffffffffffffffa0);
  FindSmallest(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void Next() override {
    assert(Valid());

    // Ensure that all children are positioned after key().
    // If we are moving in the forward direction, it is already
    // true for all of the non-current_ children since current_ is
    // the smallest child and key() == current_->key().  Otherwise,
    // we explicitly position the non-current_ children.
    if (direction_ != kForward) {
      for (int i = 0; i < n_; i++) {
        IteratorWrapper* child = &children_[i];
        if (child != current_) {
          child->Seek(key());
          if (child->Valid() &&
              comparator_->Compare(key(), child->key()) == 0) {
            child->Next();
          }
        }
      }
      direction_ = kForward;
    }

    current_->Next();
    FindSmallest();
  }